

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::EnumDescriptor::DebugString
          (EnumDescriptor *this,int depth,string *contents,DebugStringOptions *debug_string_options)

{
  int iVar1;
  int iVar2;
  Edition EVar3;
  EnumOptions *from;
  FileDescriptor *pFVar4;
  DescriptorPool *pool;
  EnumValueDescriptor *this_00;
  long lVar5;
  SymbolVisibility *visibility;
  char *__str;
  string_view sVar6;
  string_view src;
  Arg *in_stack_fffffffffffffa78;
  Arg local_468;
  string_view local_438;
  string_view local_428;
  string local_418;
  Arg local_3f8;
  string_view local_3c8;
  int local_3b4;
  undefined1 local_3b0 [4];
  int i_2;
  string_view local_380;
  Arg local_370;
  Arg local_340;
  string_view local_310;
  Arg local_300;
  string_view local_2d0;
  Arg local_2c0;
  string_view local_290;
  ReservedRange *local_280;
  ReservedRange *range;
  undefined1 local_270 [4];
  int i_1;
  string_view local_240;
  int local_22c;
  undefined1 local_228 [4];
  int i;
  EnumOptions full_options;
  Arg local_1c0;
  SymbolVisibility local_18c;
  string local_188;
  Arg local_168;
  Arg local_138;
  basic_string_view<char,_std::char_traits<char>_> local_108;
  undefined1 local_f8 [8];
  SourceLocationCommentPrinter comment_printer;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string prefix;
  DebugStringOptions *debug_string_options_local;
  string *contents_local;
  int depth_local;
  EnumDescriptor *this_local;
  
  prefix.field_2._8_8_ = debug_string_options;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_48,(long)(depth * 2),' ',&local_49);
  std::allocator<char>::~allocator(&local_49);
  anon_unknown_24::SourceLocationCommentPrinter::
  SourceLocationCommentPrinter<google::protobuf::EnumDescriptor>
            ((SourceLocationCommentPrinter *)local_f8,this,(string *)local_48,
             (DebugStringOptions *)prefix.field_2._8_8_);
  anon_unknown_24::SourceLocationCommentPrinter::AddPreComment
            ((SourceLocationCommentPrinter *)local_f8,contents);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_108,"$0$1enum $2 {\n");
  absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>
            (&local_138,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  local_18c = visibility_keyword(this);
  protobuf::(anonymous_namespace)::VisibilityToKeyword_abi_cxx11_
            (&local_188,(_anonymous_namespace_ *)&local_18c,visibility);
  absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>(&local_168,&local_188);
  sVar6 = name(this);
  full_options.field_0._64_8_ = sVar6._M_len;
  absl::lts_20250127::substitute_internal::Arg::Arg(&local_1c0,sVar6);
  sVar6._M_str = (char *)&local_138;
  sVar6._M_len = (size_t)local_108._M_str;
  absl::lts_20250127::SubstituteAndAppend
            ((lts_20250127 *)contents,(Nonnull<std::string_*>)local_108._M_len,sVar6,&local_168,
             &local_1c0,in_stack_fffffffffffffa78);
  std::__cxx11::string::~string((string *)&local_188);
  from = options(this);
  EnumOptions::EnumOptions((EnumOptions *)local_228,from);
  anon_unknown_24::CopyFeaturesToOptions<google::protobuf::EnumOptions>
            (this->proto_features_,(EnumOptions *)local_228);
  pFVar4 = file(this);
  pool = FileDescriptor::pool(pFVar4);
  anon_unknown_24::FormatLineOptions(depth + 1,(Message *)local_228,pool,contents);
  for (local_22c = 0; iVar2 = local_22c, iVar1 = value_count(this), iVar2 < iVar1;
      local_22c = local_22c + 1) {
    this_00 = value(this,local_22c);
    EnumValueDescriptor::DebugString
              (this_00,depth + 1,contents,(DebugStringOptions *)prefix.field_2._8_8_);
  }
  iVar2 = reserved_range_count(this);
  if (0 < iVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_240,"$0  reserved ");
    absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>
              ((Arg *)local_270,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
    absl::lts_20250127::SubstituteAndAppend(contents,local_240,(Arg *)local_270);
    for (range._4_4_ = 0; iVar2 = range._4_4_, iVar1 = reserved_range_count(this), iVar2 < iVar1;
        range._4_4_ = range._4_4_ + 1) {
      local_280 = reserved_range(this,range._4_4_);
      if (local_280->end == local_280->start) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_290,"$0, ");
        absl::lts_20250127::substitute_internal::Arg::Arg(&local_2c0,local_280->start);
        absl::lts_20250127::SubstituteAndAppend(contents,local_290,&local_2c0);
      }
      else if (local_280->end == 0x7fffffff) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_2d0,"$0 to max, ");
        absl::lts_20250127::substitute_internal::Arg::Arg(&local_300,local_280->start);
        absl::lts_20250127::SubstituteAndAppend(contents,local_2d0,&local_300);
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_310,"$0 to $1, ");
        absl::lts_20250127::substitute_internal::Arg::Arg(&local_340,local_280->start);
        absl::lts_20250127::substitute_internal::Arg::Arg(&local_370,local_280->end);
        absl::lts_20250127::SubstituteAndAppend(contents,local_310,&local_340,&local_370);
      }
    }
    lVar5 = std::__cxx11::string::size();
    std::__cxx11::string::replace((ulong)contents,lVar5 - 2,(char *)0x2);
  }
  iVar2 = reserved_name_count(this);
  if (0 < iVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_380,"$0  reserved ");
    absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>
              ((Arg *)local_3b0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
    absl::lts_20250127::SubstituteAndAppend(contents,local_380,(Arg *)local_3b0);
    local_3b4 = 0;
    while( true ) {
      iVar2 = local_3b4;
      iVar1 = reserved_name_count(this);
      if (iVar1 <= iVar2) break;
      pFVar4 = file(this);
      EVar3 = FileDescriptor::edition(pFVar4);
      __str = "$0, ";
      if ((int)EVar3 < 1000) {
        __str = "\"$0\", ";
      }
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_3c8,__str);
      sVar6 = reserved_name(this,local_3b4);
      src._M_len = sVar6._M_str;
      src._M_str = (char *)sVar6._M_len;
      local_428 = sVar6;
      absl::lts_20250127::CEscape_abi_cxx11_(&local_418,(lts_20250127 *)sVar6._M_len,src);
      absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>(&local_3f8,&local_418)
      ;
      absl::lts_20250127::SubstituteAndAppend(contents,local_3c8,&local_3f8);
      std::__cxx11::string::~string((string *)&local_418);
      local_3b4 = local_3b4 + 1;
    }
    lVar5 = std::__cxx11::string::size();
    std::__cxx11::string::replace((ulong)contents,lVar5 - 2,(char *)0x2);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_438,"$0}\n");
  absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>
            (&local_468,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  absl::lts_20250127::SubstituteAndAppend(contents,local_438,&local_468);
  anon_unknown_24::SourceLocationCommentPrinter::AddPostComment
            ((SourceLocationCommentPrinter *)local_f8,contents);
  EnumOptions::~EnumOptions((EnumOptions *)local_228);
  anon_unknown_24::SourceLocationCommentPrinter::~SourceLocationCommentPrinter
            ((SourceLocationCommentPrinter *)local_f8);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void EnumDescriptor::DebugString(
    int depth, std::string* contents,
    const DebugStringOptions& debug_string_options) const {
  std::string prefix(depth * 2, ' ');
  ++depth;

  SourceLocationCommentPrinter comment_printer(this, prefix,
                                               debug_string_options);
  comment_printer.AddPreComment(contents);

  absl::SubstituteAndAppend(contents, "$0$1enum $2 {\n", prefix,
                            VisibilityToKeyword(visibility_keyword()), name());

  EnumOptions full_options = options();
  CopyFeaturesToOptions(proto_features_, &full_options);
  FormatLineOptions(depth, full_options, file()->pool(), contents);

  for (int i = 0; i < value_count(); i++) {
    value(i)->DebugString(depth, contents, debug_string_options);
  }

  if (reserved_range_count() > 0) {
    absl::SubstituteAndAppend(contents, "$0  reserved ", prefix);
    for (int i = 0; i < reserved_range_count(); i++) {
      const EnumDescriptor::ReservedRange* range = reserved_range(i);
      if (range->end == range->start) {
        absl::SubstituteAndAppend(contents, "$0, ", range->start);
      } else if (range->end == INT_MAX) {
        absl::SubstituteAndAppend(contents, "$0 to max, ", range->start);
      } else {
        absl::SubstituteAndAppend(contents, "$0 to $1, ", range->start,
                                  range->end);
      }
    }
    contents->replace(contents->size() - 2, 2, ";\n");
  }

  if (reserved_name_count() > 0) {
    absl::SubstituteAndAppend(contents, "$0  reserved ", prefix);
    for (int i = 0; i < reserved_name_count(); i++) {
      absl::SubstituteAndAppend(
          contents,
          file()->edition() < Edition::EDITION_2023 ? "\"$0\", " : "$0, ",
          absl::CEscape(reserved_name(i)));
    }
    contents->replace(contents->size() - 2, 2, ";\n");
  }

  absl::SubstituteAndAppend(contents, "$0}\n", prefix);

  comment_printer.AddPostComment(contents);
}